

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O1

void __thiscall crnlib::Resampler::resample_y(Resampler *this,Sample *Pdst)

{
  int *piVar1;
  float fVar2;
  ushort uVar3;
  Sample *pSVar4;
  Contrib_List *pCVar5;
  ulong uVar6;
  Sample *Psrc;
  ulong uVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  
  Psrc = Pdst;
  if (this->m_delay_x_resample != false) {
    Psrc = this->m_Ptmp_buf;
  }
  if (this->m_Pclist_y[this->m_cur_dst_y].n != 0) {
    pCVar5 = this->m_Pclist_y + this->m_cur_dst_y;
    uVar6 = 0;
    do {
      uVar7 = 0;
      do {
        if (this->m_Pscan_buf->scan_buf_y[uVar7] == (uint)pCVar5->p[uVar6].pixel) goto LAB_001451fe;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x4000);
      uVar7 = 0x4000;
LAB_001451fe:
      pSVar4 = this->m_Pscan_buf->scan_buf_l[uVar7 & 0xffffffff];
      if (uVar6 == 0) {
        if (0 < this->m_intermediate_x) {
          fVar2 = pCVar5->p->weight;
          iVar8 = this->m_intermediate_x + 1;
          lVar9 = 0;
          do {
            *(float *)((long)Psrc + lVar9) = *(float *)((long)pSVar4 + lVar9) * fVar2;
            iVar8 = iVar8 + -1;
            lVar9 = lVar9 + 4;
          } while (1 < iVar8);
        }
      }
      else if (0 < this->m_intermediate_x) {
        fVar2 = pCVar5->p[uVar6].weight;
        iVar8 = this->m_intermediate_x + 1;
        lVar9 = 0;
        do {
          *(float *)((long)Psrc + lVar9) =
               *(float *)((long)pSVar4 + lVar9) * fVar2 + *(float *)((long)Psrc + lVar9);
          iVar8 = iVar8 + -1;
          lVar9 = lVar9 + 4;
        } while (1 < iVar8);
      }
      uVar3 = pCVar5->p[uVar6].pixel;
      piVar1 = this->m_Psrc_y_count + uVar3;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        this->m_Psrc_y_flag[uVar3] = '\0';
        this->m_Pscan_buf->scan_buf_y[uVar7 & 0xffffffff] = -1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < pCVar5->n);
  }
  if (this->m_delay_x_resample == true) {
    resample_x(this,Pdst,Psrc);
  }
  if (0 < this->m_resample_dst_x && (this->m_lo <= this->m_hi && this->m_hi != this->m_lo)) {
    iVar8 = this->m_resample_dst_x + 1;
    do {
      fVar2 = *Pdst;
      fVar10 = this->m_lo;
      if ((this->m_lo <= fVar2) && (fVar10 = fVar2, this->m_hi < fVar2)) {
        fVar10 = this->m_hi;
      }
      *Pdst = fVar10;
      Pdst = Pdst + 1;
      iVar8 = iVar8 + -1;
    } while (1 < iVar8);
  }
  return;
}

Assistant:

void Resampler::resample_y(Sample* Pdst)
    {
        int i, j;
        Sample* Psrc;
        Contrib_List* Pclist = &m_Pclist_y[m_cur_dst_y];

        Sample* Ptmp = m_delay_x_resample ? m_Ptmp_buf : Pdst;
        resampler_assert(Ptmp);

        /* Process each contributor. */

        for (i = 0; i < Pclist->n; i++)
        {
            /* locate the contributor's location in the scan
         * buffer -- the contributor must always be found!
         */

            for (j = 0; j < MAX_SCAN_BUF_SIZE; j++)
            {
                if (m_Pscan_buf->scan_buf_y[j] == Pclist->p[i].pixel)
                {
                    break;
                }
            }

            resampler_assert(j < MAX_SCAN_BUF_SIZE);

            Psrc = m_Pscan_buf->scan_buf_l[j];

            if (!i)
            {
                scale_y_mov(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }
            else
            {
                scale_y_add(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }

            /* If this source line doesn't contribute to any
         * more destination lines then mark the scanline buffer slot
         * which holds this source line as free.
         * (The max. number of slots used depends on the Y
         * axis sampling factor and the scaled filter width.)
         */

            if (--m_Psrc_y_count[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] == 0)
            {
                m_Psrc_y_flag[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] = FALSE;
                m_Pscan_buf->scan_buf_y[j] = -1;
            }
        }

        /* Now generate the destination line */

        if (m_delay_x_resample) // Was X resampling delayed until after Y resampling?
        {
            resampler_assert(Pdst != Ptmp);
            resample_x(Pdst, Ptmp);
        }
        else
        {
            resampler_assert(Pdst == Ptmp);
        }

        if (m_lo < m_hi)
        {
            clamp(Pdst, m_resample_dst_x);
        }
    }